

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_parse_url_path(connectdata *conn)

{
  curl_ftpfile cVar1;
  int iVar2;
  CURLcode CVar3;
  size_t sVar4;
  void *pvVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  size_t local_e0;
  char *local_d0;
  size_t local_c8;
  char *local_b8;
  char *pcStack_98;
  CURLcode result_3;
  char *path;
  size_t dlen;
  void *pvStack_80;
  CURLcode result_2;
  char **bigger;
  char *pcStack_70;
  CURLcode result_1;
  size_t len;
  ssize_t absolute_dir;
  size_t sStack_58;
  CURLcode result;
  size_t dirlen;
  char *filename;
  char *cur_pos;
  char *path_to_use;
  char *slash_pos;
  ftp_conn *ftpc;
  FTP *ftp;
  Curl_easy *data;
  connectdata *conn_local;
  
  ftp = (FTP *)conn->data;
  ftpc = (ftp_conn *)(((Curl_easy *)ftp)->req).protop;
  slash_pos = (char *)&conn->proto;
  pcVar6 = (char *)(ftpc->pp).nread_resp;
  dirlen = 0;
  (conn->proto).ftpc.ctl_valid = false;
  (conn->proto).ftpc.cwdfail = false;
  cVar1 = (((Curl_easy *)ftp)->set).ftp_filemethod;
  filename = pcVar6;
  cur_pos = pcVar6;
  data = (Curl_easy *)conn;
  if (cVar1 != FTPFILE_MULTICWD) {
    if (cVar1 == FTPFILE_NOCWD) {
      if ((*pcVar6 != '\0') && (sVar4 = strlen(pcVar6), pcVar6[sVar4 - 1] != '/')) {
        dirlen = (size_t)cur_pos;
      }
      goto LAB_0080fdbb;
    }
    if (cVar1 == FTPFILE_SINGLECWD) {
      if (*pcVar6 == '\0') {
        (conn->proto).ftpc.dirdepth = 0;
      }
      else {
        path_to_use = strrchr(pcVar6,0x2f);
        if ((path_to_use == (char *)0x0) && (*filename != '\0')) {
          dirlen = (size_t)filename;
        }
        else {
          sStack_58 = (long)path_to_use - (long)filename;
          pvVar5 = (*Curl_ccalloc)(1,8);
          *(void **)(slash_pos + 0x78) = pvVar5;
          if (*(long *)(slash_pos + 0x78) == 0) {
            return CURLE_OUT_OF_MEMORY;
          }
          if (sStack_58 == 0) {
            sStack_58 = 1;
          }
          if (path_to_use == (char *)0x0) {
            local_b8 = "/";
            local_c8 = 1;
          }
          else {
            local_c8 = sStack_58;
            local_b8 = filename;
          }
          absolute_dir._4_4_ =
               Curl_urldecode(data->next,local_b8,local_c8,*(char ***)(slash_pos + 0x78),
                              (size_t *)0x0,true);
          if (absolute_dir._4_4_ != CURLE_OK) {
            freedirs((ftp_conn *)slash_pos);
            return absolute_dir._4_4_;
          }
          slash_pos[0x80] = '\x01';
          slash_pos[0x81] = '\0';
          slash_pos[0x82] = '\0';
          slash_pos[0x83] = '\0';
          if (path_to_use == (char *)0x0) {
            local_d0 = filename;
          }
          else {
            local_d0 = path_to_use + 1;
          }
          dirlen = (size_t)local_d0;
          absolute_dir._4_4_ = 0;
        }
      }
      goto LAB_0080fdbb;
    }
  }
  (conn->proto).ftpc.dirdepth = 0;
  (conn->proto).ftpc.diralloc = 5;
  pvVar5 = (*Curl_ccalloc)((long)(conn->proto).ftpc.diralloc,8);
  *(void **)(slash_pos + 0x78) = pvVar5;
  if (*(long *)(slash_pos + 0x78) == 0) {
    return CURLE_OUT_OF_MEMORY;
  }
  iVar2 = strcmp(cur_pos,"/");
  if (iVar2 == 0) {
    filename = filename + 1;
    pcVar6 = (*Curl_cstrdup)("/");
    **(undefined8 **)(slash_pos + 0x78) = pcVar6;
    *(int *)(slash_pos + 0x80) = *(int *)(slash_pos + 0x80) + 1;
  }
  else {
    while (path_to_use = strchr(filename,0x2f), path_to_use != (char *)0x0) {
      bVar8 = false;
      if (0 < (long)((long)filename - (ftpc->pp).nread_resp)) {
        bVar8 = *(int *)(slash_pos + 0x80) == 0;
      }
      len = (size_t)(int)(uint)bVar8;
      if (path_to_use == filename) {
        filename = path_to_use + 1;
        if (*(int *)(slash_pos + 0x80) == 0) {
          pcVar6 = (*Curl_cstrdup)("/");
          *(char **)(*(long *)(slash_pos + 0x78) + (long)*(int *)(slash_pos + 0x80) * 8) = pcVar6;
          iVar2 = *(int *)(slash_pos + 0x80);
          *(int *)(slash_pos + 0x80) = iVar2 + 1;
          if (*(long *)(*(long *)(slash_pos + 0x78) + (long)iVar2 * 8) == 0) {
            Curl_failf((Curl_easy *)ftp,"no memory");
            freedirs((ftp_conn *)slash_pos);
            return CURLE_OUT_OF_MEMORY;
          }
        }
      }
      else {
        pcStack_70 = path_to_use + (len - (long)filename);
        bigger._4_4_ = Curl_urldecode(data->next,filename + -len,(size_t)pcStack_70,
                                      (char **)(*(long *)(slash_pos + 0x78) +
                                               (long)*(int *)(slash_pos + 0x80) * 8),(size_t *)0x0,
                                      true);
        if (bigger._4_4_ != CURLE_OK) {
          freedirs((ftp_conn *)slash_pos);
          return bigger._4_4_;
        }
        filename = path_to_use + 1;
        iVar2 = *(int *)(slash_pos + 0x80);
        *(int *)(slash_pos + 0x80) = iVar2 + 1;
        if (*(int *)(slash_pos + 0x84) <= iVar2 + 1) {
          *(int *)(slash_pos + 0x84) = *(int *)(slash_pos + 0x84) << 1;
          pvStack_80 = (*Curl_crealloc)(*(void **)(slash_pos + 0x78),
                                        (long)*(int *)(slash_pos + 0x84) << 3);
          if (pvStack_80 == (void *)0x0) {
            freedirs((ftp_conn *)slash_pos);
            return CURLE_OUT_OF_MEMORY;
          }
          *(void **)(slash_pos + 0x78) = pvStack_80;
        }
      }
    }
    path_to_use = (char *)0x0;
  }
  dirlen = (size_t)filename;
LAB_0080fdbb:
  if ((dirlen == 0) || (*(char *)dirlen == '\0')) {
    slash_pos[0x88] = '\0';
    slash_pos[0x89] = '\0';
    slash_pos[0x8a] = '\0';
    slash_pos[0x8b] = '\0';
    slash_pos[0x8c] = '\0';
    slash_pos[0x8d] = '\0';
    slash_pos[0x8e] = '\0';
    slash_pos[0x8f] = '\0';
  }
  else {
    dlen._4_4_ = Curl_urldecode(data->next,(char *)dirlen,0,(char **)(slash_pos + 0x88),
                                (size_t *)0x0,true);
    if (dlen._4_4_ != CURLE_OK) {
      freedirs((ftp_conn *)slash_pos);
      return dlen._4_4_;
    }
    dlen._4_4_ = 0;
  }
  if (((((ulong)ftp[0x4f].path >> 0x1d & 1) == 0) || (*(long *)(slash_pos + 0x88) != 0)) ||
     (*(int *)&(ftpc->pp).pending_resp != 0)) {
    slash_pos[0x92] = '\0';
    if (*(long *)(slash_pos + 0xa0) != 0) {
      CVar3 = Curl_urldecode(data->next,(char *)(ftpc->pp).nread_resp,0,&stack0xffffffffffffff68,
                             (size_t *)&path,true);
      if (CVar3 != CURLE_OK) {
        freedirs((ftp_conn *)slash_pos);
        return CVar3;
      }
      if (*(long *)(slash_pos + 0x88) == 0) {
        local_e0 = 0;
      }
      else {
        local_e0 = strlen(*(char **)(slash_pos + 0x88));
      }
      pcVar6 = path + -local_e0;
      path = pcVar6;
      pcVar7 = (char *)strlen(*(char **)(slash_pos + 0xa0));
      if (((pcVar6 == pcVar7) &&
          (iVar2 = strncmp(pcStack_98,*(char **)(slash_pos + 0xa0),(size_t)path), iVar2 == 0)) &&
         (*(int *)(slash_pos + 0xa8) == *(int *)&ftp[0x3f].path)) {
        Curl_infof((Curl_easy *)ftp,"Request has same path as previous transfer\n");
        slash_pos[0x92] = '\x01';
      }
      (*Curl_cfree)(pcStack_98);
    }
    conn_local._4_4_ = CURLE_OK;
  }
  else {
    Curl_failf((Curl_easy *)ftp,"Uploading to a URL without a file name!");
    conn_local._4_4_ = CURLE_URL_MALFORMAT;
  }
  return conn_local._4_4_;
}

Assistant:

static
CURLcode ftp_parse_url_path(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  /* the ftp struct is already inited in ftp_connect() */
  struct FTP *ftp = data->req.protop;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  const char *slash_pos;  /* position of the first '/' char in curpos */
  const char *path_to_use = ftp->path;
  const char *cur_pos;
  const char *filename = NULL;

  cur_pos = path_to_use; /* current position in path. point at the begin of
                            next path component */

  ftpc->ctl_valid = FALSE;
  ftpc->cwdfail = FALSE;

  switch(data->set.ftp_filemethod) {
  case FTPFILE_NOCWD:
    /* fastest, but less standard-compliant */

    /*
      The best time to check whether the path is a file or directory is right
      here. so:

      the first condition in the if() right here, is there just in case
      someone decides to set path to NULL one day
   */
    if(path_to_use[0] &&
       (path_to_use[strlen(path_to_use) - 1] != '/') )
      filename = path_to_use;  /* this is a full file path */
    /*
      else {
        ftpc->file is not used anywhere other than for operations on a file.
        In other words, never for directory operations.
        So we can safely leave filename as NULL here and use it as a
        argument in dir/file decisions.
      }
    */
    break;

  case FTPFILE_SINGLECWD:
    /* get the last slash */
    if(!path_to_use[0]) {
      /* no dir, no file */
      ftpc->dirdepth = 0;
      break;
    }
    slash_pos = strrchr(cur_pos, '/');
    if(slash_pos || !*cur_pos) {
      size_t dirlen = slash_pos-cur_pos;
      CURLcode result;

      ftpc->dirs = calloc(1, sizeof(ftpc->dirs[0]));
      if(!ftpc->dirs)
        return CURLE_OUT_OF_MEMORY;

      if(!dirlen)
        dirlen++;

      result = Curl_urldecode(conn->data, slash_pos ? cur_pos : "/",
                              slash_pos ? dirlen : 1,
                              &ftpc->dirs[0], NULL,
                              TRUE);
      if(result) {
        freedirs(ftpc);
        return result;
      }
      ftpc->dirdepth = 1; /* we consider it to be a single dir */
      filename = slash_pos ? slash_pos + 1 : cur_pos; /* rest is file name */
    }
    else
      filename = cur_pos;  /* this is a file name only */
    break;

  default: /* allow pretty much anything */
  case FTPFILE_MULTICWD:
    ftpc->dirdepth = 0;
    ftpc->diralloc = 5; /* default dir depth to allocate */
    ftpc->dirs = calloc(ftpc->diralloc, sizeof(ftpc->dirs[0]));
    if(!ftpc->dirs)
      return CURLE_OUT_OF_MEMORY;

    /* we have a special case for listing the root dir only */
    if(!strcmp(path_to_use, "/")) {
      cur_pos++; /* make it point to the zero byte */
      ftpc->dirs[0] = strdup("/");
      ftpc->dirdepth++;
    }
    else {
      /* parse the URL path into separate path components */
      while((slash_pos = strchr(cur_pos, '/')) != NULL) {
        /* 1 or 0 pointer offset to indicate absolute directory */
        ssize_t absolute_dir = ((cur_pos - ftp->path > 0) &&
                                (ftpc->dirdepth == 0))?1:0;

        /* seek out the next path component */
        if(slash_pos-cur_pos) {
          /* we skip empty path components, like "x//y" since the FTP command
             CWD requires a parameter and a non-existent parameter a) doesn't
             work on many servers and b) has no effect on the others. */
          size_t len = slash_pos - cur_pos + absolute_dir;
          CURLcode result =
            Curl_urldecode(conn->data, cur_pos - absolute_dir, len,
                           &ftpc->dirs[ftpc->dirdepth], NULL,
                           TRUE);
          if(result) {
            freedirs(ftpc);
            return result;
          }
        }
        else {
          cur_pos = slash_pos + 1; /* jump to the rest of the string */
          if(!ftpc->dirdepth) {
            /* path starts with a slash, add that as a directory */
            ftpc->dirs[ftpc->dirdepth] = strdup("/");
            if(!ftpc->dirs[ftpc->dirdepth++]) { /* run out of memory ... */
              failf(data, "no memory");
              freedirs(ftpc);
              return CURLE_OUT_OF_MEMORY;
            }
          }
          continue;
        }

        cur_pos = slash_pos + 1; /* jump to the rest of the string */
        if(++ftpc->dirdepth >= ftpc->diralloc) {
          /* enlarge array */
          char **bigger;
          ftpc->diralloc *= 2; /* double the size each time */
          bigger = realloc(ftpc->dirs, ftpc->diralloc * sizeof(ftpc->dirs[0]));
          if(!bigger) {
            freedirs(ftpc);
            return CURLE_OUT_OF_MEMORY;
          }
          ftpc->dirs = bigger;
        }
      }
    }
    filename = cur_pos;  /* the rest is the file name */
    break;
  } /* switch */

  if(filename && *filename) {
    CURLcode result =
      Curl_urldecode(conn->data, filename, 0,  &ftpc->file, NULL, TRUE);

    if(result) {
      freedirs(ftpc);
      return result;
    }
  }
  else
    ftpc->file = NULL; /* instead of point to a zero byte, we make it a NULL
                          pointer */

  if(data->set.upload && !ftpc->file && (ftp->transfer == FTPTRANSFER_BODY)) {
    /* We need a file name when uploading. Return error! */
    failf(data, "Uploading to a URL without a file name!");
    return CURLE_URL_MALFORMAT;
  }

  ftpc->cwddone = FALSE; /* default to not done */

  if(ftpc->prevpath) {
    /* prevpath is "raw" so we convert the input path before we compare the
       strings */
    size_t dlen;
    char *path;
    CURLcode result =
      Curl_urldecode(conn->data, ftp->path, 0, &path, &dlen, TRUE);
    if(result) {
      freedirs(ftpc);
      return result;
    }

    dlen -= ftpc->file?strlen(ftpc->file):0;
    if((dlen == strlen(ftpc->prevpath)) &&
       !strncmp(path, ftpc->prevpath, dlen) &&
       (ftpc->prevmethod == data->set.ftp_filemethod)) {
      infof(data, "Request has same path as previous transfer\n");
      ftpc->cwddone = TRUE;
    }
    free(path);
  }

  return CURLE_OK;
}